

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float64 float64_sub_sparc(float64 a,float64 b,float_status *s)

{
  _Bool _Var1;
  int iVar2;
  float64 fVar3;
  byte bVar4;
  double dVar5;
  
  bVar4 = s->float_exception_flags;
  if (((bVar4 & 0x20) == 0) || (s->float_rounding_mode != '\0')) goto LAB_009c5faf;
  if (s->flush_inputs_to_zero != '\0') {
    if ((a & 0x7fffffffffffffff) == 0 || (a & 0x7ff0000000000000) != 0) {
      if ((b & 0x7fffffffffffffff) == 0 || (b & 0x7ff0000000000000) != 0) goto LAB_009c5ebe;
LAB_009c5f8a:
      b = b & 0x8000000000000000;
      bVar4 = bVar4 | 0x40;
    }
    else {
      a = a & 0x8000000000000000;
      bVar4 = bVar4 | 0x40;
      if ((b & 0x7ff0000000000000) == 0 && (b & 0x7fffffffffffffff) != 0) goto LAB_009c5f8a;
    }
    s->float_exception_flags = bVar4;
  }
LAB_009c5ebe:
  iVar2 = __fpclassify((double)a);
  if ((iVar2 == 4) || (iVar2 == 2)) {
    iVar2 = __fpclassify((double)b);
    if ((iVar2 == 4) || (iVar2 == 2)) {
      dVar5 = (double)a - (double)b;
      if (ABS(dVar5) == INFINITY) {
        s->float_exception_flags = bVar4 | 8;
      }
      else if (ABS(dVar5) <= 2.2250738585072014e-308) {
        _Var1 = f64_addsub_post((union_float64)a,(union_float64)b);
        if (_Var1) goto LAB_009c5faf;
      }
      return (float64)dVar5;
    }
  }
LAB_009c5faf:
  fVar3 = soft_f64_addsub(a,b,true,s);
  return fVar3;
}

Assistant:

float64 QEMU_FLATTEN
float64_sub(float64 a, float64 b, float_status *s)
{
    return float64_addsub(a, b, s, hard_f64_sub, soft_f64_sub);
}